

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void AlphaApplyFilter(ALPHDecoder *alph_dec,int first_row,int last_row,uint8_t *out,int stride)

{
  uint8_t *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  uint8_t *prev_line;
  int y;
  uint8_t *local_28;
  int local_20;
  uint8_t *local_18;
  
  if (*(int *)(in_RDI + 0xc) != 0) {
    local_28 = *(uint8_t **)(in_RDI + 0xd0);
    local_18 = in_RCX;
    for (local_20 = in_ESI; local_20 < in_EDX; local_20 = local_20 + 1) {
      (*WebPUnfilters[*(uint *)(in_RDI + 0xc)])(local_28,local_18,local_18,in_R8D);
      local_28 = local_18;
      local_18 = local_18 + in_R8D;
    }
    *(uint8_t **)(in_RDI + 0xd0) = local_28;
  }
  return;
}

Assistant:

static void AlphaApplyFilter(ALPHDecoder* const alph_dec,
                             int first_row, int last_row,
                             uint8_t* out, int stride) {
  if (alph_dec->filter_ != WEBP_FILTER_NONE) {
    int y;
    const uint8_t* prev_line = alph_dec->prev_line_;
    assert(WebPUnfilters[alph_dec->filter_] != NULL);
    for (y = first_row; y < last_row; ++y) {
      WebPUnfilters[alph_dec->filter_](prev_line, out, out, stride);
      prev_line = out;
      out += stride;
    }
    alph_dec->prev_line_ = prev_line;
  }
}